

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O2

int __thiscall EventDispatcher::remove(EventDispatcher *this,char *__filename)

{
  int iVar1;
  TimerManager *this_00;
  SyncRetEventAgent<int> *this_01;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  iVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((char)iVar1 != '\0') {
    this_00 = TimerManager::getInstance();
    TimerManager::removeTimedEvent(this_00,(Event *)__filename);
    EventQueue::Remove(&this->mQueue,(Event *)__filename);
    return 0;
  }
  this_01 = (SyncRetEventAgent<int> *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                         ,0xe7);
  *(undefined8 *)&this_01->field_0x8 = 0xfffffffb00000000;
  *(undefined ***)this_01 = &PTR_onRefCountZero_0012ffe8;
  *(EventDispatcher **)(this_01 + 1) = this;
  *(undefined8 *)&this_01[1].field_0x8 = 0x29;
  *(undefined8 *)&this_01[1].field_0x10 = 0;
  *(char **)(this_01 + 2) = __filename;
  *(undefined4 *)&this_01->field_0x10 = 1;
  sVar2 = SyncRetEventAgent<int>::send(this_01,(int)this,__buf,0x12ffe8,in_R8D);
  return (int)sVar2;
}

Assistant:

int EventDispatcher::remove( Event *ev )
{
	if (not isThreadCurrent())
	{
		SyncRetEventAgent1<EventDispatcher, int, Event*>* e = 
			jh_new SyncRetEventAgent1<EventDispatcher, int, Event*>
			(this, &EventDispatcher::remove, ev);

		// I am a bad person, but it's either this or make all
		// EventAgent's publicly inherit from Event (instead of
		// Protected inheritance), and that's a big ugly change for
		// little benefit.
		((Event*)e)->setPriority(PRIORITY_HIGH);

		return e->send(this);
	}

	//  It is important that we remove events from the TimerManager first.  
	//  This ensure that an event does not get dispatched to the queue after we
	//  clear the queue.
	TimerManager *timerMan = TimerManager::getInstance();
	timerMan->removeTimedEvent( ev );
	mQueue.Remove( ev );	
	return 0;
}